

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

int gfield::legendre<13>(bigint<13> *x)

{
  int iVar1;
  bigint<13> *pbVar2;
  undefined1 local_6c [8];
  gfield L;
  bigint<1> local_40;
  gfint local_38;
  bigint<13> *local_18;
  bigint<13> *x_local;
  
  local_18 = x;
  if (legendre<13>(bigint<int>const&)::Psub1div2 == '\0') {
    iVar1 = __cxa_guard_acquire(&legendre<13>(bigint<int>const&)::Psub1div2);
    if (iVar1 != 0) {
      local_38.digits[6] = P.super_gfint.digits[6];
      local_38.digits[7] = P.super_gfint.digits[7];
      local_38.digits[8] = P.super_gfint.digits[8];
      local_38.digits[9] = P.super_gfint.digits[9];
      local_38.digits[10] = P.super_gfint.digits[10];
      local_38.digits[0xb] = P.super_gfint.digits[0xb];
      local_38.digits[0xc] = P.super_gfint.digits[0xc];
      local_38.len = P.super_gfint.len;
      local_38.digits[0] = P.super_gfint.digits[0];
      local_38.digits[1] = P.super_gfint.digits[1];
      local_38.digits[2] = P.super_gfint.digits[2];
      local_38.digits[3] = P.super_gfint.digits[3];
      local_38.digits[4] = P.super_gfint.digits[4];
      local_38.digits[5] = P.super_gfint.digits[5];
      bigint<1>::bigint(&local_40,1);
      pbVar2 = bigint<13>::sub<1>(&local_38,&local_40);
      pbVar2 = bigint<13>::rshift(pbVar2,1);
      legendre<13>::Psub1div2.len = pbVar2->len;
      legendre<13>::Psub1div2.digits[0] = pbVar2->digits[0];
      legendre<13>::Psub1div2.digits[1] = pbVar2->digits[1];
      legendre<13>::Psub1div2.digits._4_8_ = *(undefined8 *)(pbVar2->digits + 2);
      legendre<13>::Psub1div2.digits._12_8_ = *(undefined8 *)(pbVar2->digits + 6);
      legendre<13>::Psub1div2._24_8_ = *(undefined8 *)(pbVar2->digits + 10);
      __cxa_guard_release(&legendre<13>(bigint<int>const&)::Psub1div2);
    }
  }
  gfield((gfield *)local_6c);
  pow<13,13>((gfield *)local_6c,local_18,&legendre<13>::Psub1div2);
  if (local_6c._0_4_ == 0) {
    x_local._4_4_ = 0;
  }
  else if (local_6c._0_4_ == 1) {
    x_local._4_4_ = 1;
  }
  else {
    x_local._4_4_ = -1;
  }
  return x_local._4_4_;
}

Assistant:

static int legendre(const bigint<X_DIGITS> &x)
    {
        static const gfint Psub1div2(gfint(P).sub(bigint<1>(1)).rshift(1));
        gfield L;
        L.pow(x, Psub1div2);
        if(!L.len) return 0;
        if(L.len==1) return 1;
        return -1;
    }